

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streambuf.c
# Opt level: O0

void quicly_sendbuf_emit(quicly_stream_t *stream,quicly_sendbuf_t *sb,size_t off,void *dst,
                        size_t *len,int *wrote_all)

{
  int iVar1;
  quicly_stream_t *stream_00;
  ulong uVar2;
  long in_RCX;
  long in_RDX;
  long *in_RSI;
  ulong *in_R8;
  undefined4 *in_R9;
  bool bVar3;
  int partial;
  size_t bytes_flatten;
  quicly_sendbuf_vec_t *vec;
  int ret;
  size_t capacity;
  size_t vec_index;
  ulong local_40;
  ulong local_38;
  long local_20;
  ulong local_18;
  
  local_40 = *in_R8;
  local_18 = in_RSI[3] + in_RDX;
  local_38 = 0;
  local_20 = in_RCX;
  while( true ) {
    bVar3 = false;
    if (local_40 != 0) {
      bVar3 = local_38 < (ulong)in_RSI[1];
    }
    if (!bVar3) break;
    stream_00 = (quicly_stream_t *)(*in_RSI + local_38 * 0x18);
    if (local_18 < (ulong)stream_00->stream_id) {
      uVar2 = stream_00->stream_id - local_18;
      bVar3 = local_40 < uVar2;
      if (bVar3) {
        uVar2 = local_40;
      }
      iVar1 = (*(code *)(stream_00->conn->super).ctx)(stream_00,local_20,local_18,uVar2);
      if (iVar1 != 0) {
        convert_error(stream_00,(int)(uVar2 >> 0x20));
        return;
      }
      local_20 = local_20 + uVar2;
      local_40 = local_40 - uVar2;
      local_18 = 0;
      if (bVar3) break;
    }
    else {
      local_18 = local_18 - stream_00->stream_id;
    }
    local_38 = local_38 + 1;
  }
  if ((local_40 == 0) && (local_38 < (ulong)in_RSI[1])) {
    *in_R9 = 0;
  }
  else {
    *in_R8 = *in_R8 - local_40;
    *in_R9 = 1;
  }
  return;
}

Assistant:

void quicly_sendbuf_emit(quicly_stream_t *stream, quicly_sendbuf_t *sb, size_t off, void *dst, size_t *len, int *wrote_all)
{
    size_t vec_index, capacity = *len;
    int ret;

    off += sb->off_in_first_vec;
    for (vec_index = 0; capacity != 0 && vec_index < sb->vecs.size; ++vec_index) {
        quicly_sendbuf_vec_t *vec = sb->vecs.entries + vec_index;
        if (off < vec->len) {
            size_t bytes_flatten = vec->len - off;
            int partial = 0;
            if (capacity < bytes_flatten) {
                bytes_flatten = capacity;
                partial = 1;
            }
            if ((ret = vec->cb->flatten_vec(vec, dst, off, bytes_flatten)) != 0) {
                convert_error(stream, ret);
                return;
            }
            dst = (uint8_t *)dst + bytes_flatten;
            capacity -= bytes_flatten;
            off = 0;
            if (partial)
                break;
        } else {
            off -= vec->len;
        }
    }

    if (capacity == 0 && vec_index < sb->vecs.size) {
        *wrote_all = 0;
    } else {
        *len = *len - capacity;
        *wrote_all = 1;
    }
}